

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Trigger * triggersReallyExist(Parse *pParse,Table *pTab,int op,ExprList *pChanges,int *pMask)

{
  Trigger **ppTVar1;
  int iVar2;
  Trigger *pTVar3;
  uint in_EDX;
  char *pcVar4;
  long in_RSI;
  Parse *in_RDI;
  uint *in_R8;
  bool bVar5;
  Trigger *p;
  Trigger *pList;
  int mask;
  ExprList *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  Trigger *local_40;
  uint in_stack_ffffffffffffffd0;
  uint uVar6;
  
  uVar6 = 0;
  pTVar3 = sqlite3TriggerList((Parse *)(ulong)in_stack_ffffffffffffffd0,(Table *)0x0);
  if (pTVar3 != (Trigger *)0x0) {
    local_40 = pTVar3;
    if (((in_RDI->db->flags & 0x40000) == 0) && (*(long *)(in_RSI + 0x58) != 0)) {
      if (pTVar3 == *(Trigger **)(in_RSI + 0x58)) {
        pTVar3 = (Trigger *)0x0;
        goto LAB_0021317f;
      }
      while( true ) {
        bVar5 = false;
        if (local_40->pNext != (Trigger *)0x0) {
          bVar5 = local_40->pNext != *(Trigger **)(in_RSI + 0x58);
        }
        if (!bVar5) break;
        local_40 = local_40->pNext;
      }
      local_40->pNext = (Trigger *)0x0;
      in_stack_ffffffffffffffbf = 0;
      local_40 = pTVar3;
    }
    do {
      if ((local_40->op == in_EDX) &&
         (iVar2 = checkColumnOverlap((IdList *)
                                     CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                                     in_stack_ffffffffffffffb0), iVar2 != 0)) {
        uVar6 = local_40->tr_tm | uVar6;
      }
      else if (local_40->op == 0x97) {
        local_40->op = (u8)in_EDX;
        if (*(char *)(in_RSI + 0x3f) == '\x01') {
          if (in_EDX != 0x80) {
            pcVar4 = "UPDATE";
            if (in_EDX == 0x81) {
              pcVar4 = "DELETE";
            }
            sqlite3ErrorMsg(in_RDI,"%s RETURNING is not available on virtual tables",pcVar4);
          }
          local_40->tr_tm = '\x01';
        }
        else {
          local_40->tr_tm = '\x02';
        }
        uVar6 = local_40->tr_tm | uVar6;
      }
      else if ((((local_40->bReturning != '\0') && (local_40->op == 0x80)) && (in_EDX == 0x82)) &&
              (in_RDI->pToplevel == (Parse *)0x0)) {
        uVar6 = local_40->tr_tm | uVar6;
      }
      ppTVar1 = &local_40->pNext;
      local_40 = *ppTVar1;
    } while (*ppTVar1 != (Trigger *)0x0);
  }
LAB_0021317f:
  if (in_R8 != (uint *)0x0) {
    *in_R8 = uVar6;
  }
  if (uVar6 == 0) {
    pTVar3 = (Trigger *)0x0;
  }
  return pTVar3;
}

Assistant:

static SQLITE_NOINLINE Trigger *triggersReallyExist(
  Parse *pParse,          /* Parse context */
  Table *pTab,            /* The table the contains the triggers */
  int op,                 /* one of TK_DELETE, TK_INSERT, TK_UPDATE */
  ExprList *pChanges,     /* Columns that change in an UPDATE statement */
  int *pMask              /* OUT: Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
){
  int mask = 0;
  Trigger *pList = 0;
  Trigger *p;

  pList = sqlite3TriggerList(pParse, pTab);
  assert( pList==0 || IsVirtual(pTab)==0
           || (pList->bReturning && pList->pNext==0) );
  if( pList!=0 ){
    p = pList;
    if( (pParse->db->flags & SQLITE_EnableTrigger)==0
     && pTab->pTrigger!=0
    ){
      /* The SQLITE_DBCONFIG_ENABLE_TRIGGER setting is off.  That means that
      ** only TEMP triggers are allowed.  Truncate the pList so that it
      ** includes only TEMP triggers */
      if( pList==pTab->pTrigger ){
        pList = 0;
        goto exit_triggers_exist;
      }
      while( ALWAYS(p->pNext) && p->pNext!=pTab->pTrigger ) p = p->pNext;
      p->pNext = 0;
      p = pList;
    }
    do{
      if( p->op==op && checkColumnOverlap(p->pColumns, pChanges) ){
        mask |= p->tr_tm;
      }else if( p->op==TK_RETURNING ){
        /* The first time a RETURNING trigger is seen, the "op" value tells
        ** us what time of trigger it should be. */
        assert( sqlite3IsToplevel(pParse) );
        p->op = op;
        if( IsVirtual(pTab) ){
          if( op!=TK_INSERT ){
            sqlite3ErrorMsg(pParse,
              "%s RETURNING is not available on virtual tables",
              op==TK_DELETE ? "DELETE" : "UPDATE");
          }
          p->tr_tm = TRIGGER_BEFORE;
        }else{
          p->tr_tm = TRIGGER_AFTER;
        }
        mask |= p->tr_tm;
      }else if( p->bReturning && p->op==TK_INSERT && op==TK_UPDATE
                && sqlite3IsToplevel(pParse) ){
        /* Also fire a RETURNING trigger for an UPSERT */
        mask |= p->tr_tm;
      }
      p = p->pNext;
    }while( p );
  }
exit_triggers_exist:
  if( pMask ){
    *pMask = mask;
  }
  return (mask ? pList : 0);
}